

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

DWORD __thiscall
TFileNameDatabase::GetPathFragmentOffset2
          (TFileNameDatabase *this,DWORD *index_hibits,DWORD index_lobits)

{
  int iVar1;
  uint *puVar2;
  byte bVar3;
  DWORD DVar4;
  uint uVar5;
  ulong uVar6;
  
  if (*index_hibits == 0xffffffff) {
    DVar4 = TSparseArray::GetItemValueAt(&this->CollisionHiBitsIndexes,(ulong)index_lobits);
  }
  else {
    DVar4 = *index_hibits + 1;
  }
  *index_hibits = DVar4;
  iVar1 = *(int *)&(this->HiBitsTable).super_TGenericArray<unsigned_int>.field_0x14;
  uVar5 = DVar4 * iVar1;
  uVar6 = (ulong)(uVar5 >> 5);
  puVar2 = (this->HiBitsTable).super_TGenericArray<unsigned_int>.ItemArray;
  if (iVar1 + (uVar5 & 0x1f) < 0x21) {
    uVar5 = puVar2[uVar6] >> (sbyte)(uVar5 & 0x1f);
  }
  else {
    bVar3 = (byte)uVar5 & 0x1f;
    uVar5 = puVar2[uVar6] >> bVar3 | puVar2[uVar6 + 1] << 0x20 - bVar3;
  }
  if (index_lobits < (this->LoBitsTable).ItemCount) {
    return (uint)(this->LoBitsTable).ItemArray[index_lobits] |
           (uVar5 & (this->HiBitsTable).EntryBitMask) << 8;
  }
  __assert_fail("index < ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                ,0x1d0,"T &TGenericArray<unsigned char>::operator[](size_t) [T = unsigned char]");
}

Assistant:

DWORD GetPathFragmentOffset2(DWORD & index_hibits, DWORD index_lobits)
    {
        // If the hi-bits index is invalid, we need to get its starting value
        if (index_hibits == CASC_INVALID_INDEX)
        {
/*
            printf("\n");
            for (DWORD i = 0; i < CollisionHiBitsIndexes.TotalItemCount; i++)
            {
                if (CollisionHiBitsIndexes.IsItemPresent(i))
                    printf("[%02X] = %02X\n", i, CollisionHiBitsIndexes.GetIntValueAt(i));
                else
                    printf("[%02X] = NOT_PRESENT\n", i);
            }
*/
            index_hibits = CollisionHiBitsIndexes.GetItemValueAt(index_lobits);
        }
        else
        {
            index_hibits++;
        }

        // Now we use both NodeIndex and HiBits index for retrieving the path fragment index
        return (HiBitsTable.GetItem(index_hibits) << 0x08) | LoBitsTable[index_lobits];
    }